

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

void __thiscall
duckdb::CMChildInfo::CMChildInfo
          (CMChildInfo *this,LogicalOperator *op,column_binding_set_t *referenced_bindings)

{
  _Hash_node_base *p_Var1;
  reference pvVar2;
  size_type __n;
  reference rVar3;
  allocator_type local_2a;
  bool local_29;
  
  (*op->_vptr_LogicalOperator[2])();
  this->types = &op->types;
  local_29 = true;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&(this->can_compress).super_vector<bool,_std::allocator<bool>_>,
             (long)(this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_29,&local_2a);
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (referenced_bindings->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0
      ; p_Var1 = p_Var1->_M_nxt) {
    if ((this->bindings_before).
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->bindings_before).
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar2 = vector<duckdb::ColumnBinding,_true>::operator[](&this->bindings_before,__n);
        if ((p_Var1[1]._M_nxt == (_Hash_node_base *)pvVar2->table_index) &&
           (p_Var1[2]._M_nxt == (_Hash_node_base *)pvVar2->column_index)) {
          rVar3 = vector<bool,_true>::get<true>(&this->can_compress,__n);
          *rVar3._M_p = *rVar3._M_p & ~rVar3._M_mask;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->bindings_before).
                                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   .
                                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->bindings_before).
                                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   .
                                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
  }
  return;
}

Assistant:

CMChildInfo::CMChildInfo(LogicalOperator &op, const column_binding_set_t &referenced_bindings)
    : bindings_before(op.GetColumnBindings()), types(op.types), can_compress(bindings_before.size(), true) {
	for (const auto &binding : referenced_bindings) {
		for (idx_t binding_idx = 0; binding_idx < bindings_before.size(); binding_idx++) {
			if (binding == bindings_before[binding_idx]) {
				can_compress[binding_idx] = false;
			}
		}
	}
}